

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O0

bool __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Constructor::operator==
          (Dynamic_Object_Constructor *this,Proxy_Function_Base *f)

{
  __type_conflict2 _Var1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  byte local_39;
  long local_38;
  Dynamic_Object_Constructor *dc;
  Proxy_Function_Base *f_local;
  Dynamic_Object_Constructor *this_local;
  
  if (f == (Proxy_Function_Base *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = __dynamic_cast(f,&Proxy_Function_Base::typeinfo,&typeinfo,0);
  }
  local_39 = 0;
  if (local_38 != 0) {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_38 + 0x28),&this->m_type_name);
    local_39 = 0;
    if (_Var1) {
      peVar3 = Catch::clara::std::
               __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)(local_38 + 0x48));
      peVar4 = Catch::clara::std::
               __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_func);
      iVar2 = (*peVar3->_vptr_Proxy_Function_Base[2])(peVar3,peVar4);
      local_39 = (byte)iVar2;
    }
  }
  return (bool)(local_39 & 1);
}

Assistant:

bool operator==(const Proxy_Function_Base &f) const noexcept override {
          const Dynamic_Object_Constructor *dc = dynamic_cast<const Dynamic_Object_Constructor *>(&f);
          return (dc != nullptr) && dc->m_type_name == m_type_name && (*dc->m_func) == (*m_func);
        }